

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_watch_file_twice(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  char path [25];
  uv_timer_t timer;
  uv_fs_event_t watchers [2];
  char local_188 [40];
  uv_timer_t local_160;
  uv_fs_event_t local_e8;
  uv_fs_event_t local_80;
  
  builtin_strncpy(local_188 + 0x10,"pty_file",9);
  builtin_strncpy(local_188,"test/fixtures/em",0x10);
  loop = uv_default_loop();
  local_160.data = &local_e8;
  iVar1 = uv_fs_event_init(loop,(uv_fs_event_t *)local_160.data);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&local_e8,fail_cb,local_188,0);
    if (iVar1 != 0) goto LAB_00184d47;
    iVar1 = uv_fs_event_init(loop,&local_80);
    if (iVar1 != 0) goto LAB_00184d54;
    iVar1 = uv_fs_event_start(&local_80,fail_cb,local_188,0);
    if (iVar1 != 0) goto LAB_00184d61;
    iVar1 = uv_timer_init(loop,&local_160);
    if (iVar1 != 0) goto LAB_00184d6e;
    iVar1 = uv_timer_start(&local_160,timer_cb_watch_twice,10,0);
    if (iVar1 != 0) goto LAB_00184d7b;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00184d95;
    }
  }
  else {
    run_test_fs_event_watch_file_twice_cold_1();
LAB_00184d47:
    run_test_fs_event_watch_file_twice_cold_2();
LAB_00184d54:
    run_test_fs_event_watch_file_twice_cold_3();
LAB_00184d61:
    run_test_fs_event_watch_file_twice_cold_4();
LAB_00184d6e:
    run_test_fs_event_watch_file_twice_cold_5();
LAB_00184d7b:
    run_test_fs_event_watch_file_twice_cold_6();
  }
  run_test_fs_event_watch_file_twice_cold_7();
LAB_00184d95:
  run_test_fs_event_watch_file_twice_cold_8();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,0x7c,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file_twice) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  const char path[] = "test/fixtures/empty_file";
  uv_fs_event_t watchers[2];
  uv_timer_t timer;
  uv_loop_t* loop;

  loop = uv_default_loop();
  timer.data = watchers;

  ASSERT_OK(uv_fs_event_init(loop, watchers + 0));
  ASSERT_OK(uv_fs_event_start(watchers + 0, fail_cb, path, 0));
  ASSERT_OK(uv_fs_event_init(loop, watchers + 1));
  ASSERT_OK(uv_fs_event_start(watchers + 1, fail_cb, path, 0));
  ASSERT_OK(uv_timer_init(loop, &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_cb_watch_twice, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}